

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_build_err.cxx
# Opt level: O1

void __thiscall xray_re::xr_build_err::save(xr_build_err *this,xr_writer *w)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  ulong uVar2;
  
  xr_writer::open_chunk(w,0);
  local_2c = 0;
  (*w->_vptr_xr_writer[2])(w,&local_2c,4);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,1);
  local_28 = 0;
  (*w->_vptr_xr_writer[2])(w,&local_28,4);
  xr_writer::close_chunk(w);
  iVar1 = (*(this->m_invalid->super_xr_writer)._vptr_xr_writer[4])();
  uVar2 = CONCAT44(extraout_var,iVar1);
  xr_writer::open_chunk(w,2);
  local_24 = (undefined4)(uVar2 / 0x24);
  (*w->_vptr_xr_writer[2])(w,&local_24,4);
  if (uVar2 != 0) {
    (*w->_vptr_xr_writer[2])
              (w,(this->m_invalid->m_buffer).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,uVar2);
  }
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_build_err::save(xr_writer& w) const
{
	w.open_chunk(ERR_CHUNK_TJUNCTION);
	w.w_u32(0);
	w.close_chunk();

	w.open_chunk(ERR_CHUNK_MULTIEDGE);
	w.w_u32(0);
	w.close_chunk();

	size_t size = m_invalid->tell();
	w.open_chunk(ERR_CHUNK_INVALID);
	w.w_size_u32(size/(3*sizeof(fvector3)));
	if (size)
		w.w_raw(m_invalid->data(), size);
	w.close_chunk();
}